

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall cppjieba::Trie::InsertNode(Trie *this,Unicode *key,DictUnit *ptValue)

{
  unordered_map<unsigned_int,cppjieba::TrieNode*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,cppjieba::TrieNode*>>>
  *this_00;
  bool bVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
  *this_01;
  TrieNode *this_02;
  pointer pvVar4;
  pair<unsigned_int,_cppjieba::TrieNode_*> pVar5;
  pair<unsigned_int,_cppjieba::TrieNode_*> local_78 [2];
  TrieNode *local_58;
  TrieNode *nextNode;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_40;
  const_iterator local_38;
  const_iterator citer;
  TrieNode *ptNode;
  const_iterator kmIter;
  DictUnit *ptValue_local;
  Unicode *key_local;
  Trie *this_local;
  
  kmIter.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)ptValue;
  puVar2 = limonp::LocalVector<unsigned_int>::begin(key);
  puVar3 = limonp::LocalVector<unsigned_int>::end(key);
  if (puVar2 != puVar3) {
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                *)&ptNode);
    citer = (const_iterator)this->root_;
    for (local_38 = limonp::LocalVector<unsigned_int>::begin(key); puVar2 = local_38,
        puVar3 = limonp::LocalVector<unsigned_int>::end(key), puVar2 != puVar3;
        local_38 = local_38 + 1) {
      if (*(long *)citer == 0) {
        this_01 = (unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                   *)operator_new(0x38);
        std::
        unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
        ::unordered_map(this_01);
        *(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
          **)citer = this_01;
      }
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::find(*(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                    **)citer,local_38);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)&local_40,
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)&local_48);
      ptNode = (TrieNode *)local_40._M_cur;
      nextNode = (TrieNode *)
                 std::
                 unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                 ::end(*(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                         **)citer);
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                          *)&nextNode,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                          *)&ptNode);
      if (bVar1) {
        this_02 = (TrieNode *)operator_new(0x10);
        TrieNode::TrieNode(this_02);
        this_00 = *(unordered_map<unsigned_int,cppjieba::TrieNode*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,cppjieba::TrieNode*>>>
                    **)citer;
        local_58 = this_02;
        pVar5 = std::make_pair<unsigned_int_const&,cppjieba::TrieNode*&>(local_38,&local_58);
        local_78[0].second = pVar5.second;
        local_78[0].first = pVar5.first;
        std::
        unordered_map<unsigned_int,cppjieba::TrieNode*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,cppjieba::TrieNode*>>>
        ::insert<std::pair<unsigned_int,cppjieba::TrieNode*>>(this_00,local_78);
        citer = (const_iterator)local_58;
      }
      else {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                               *)&ptNode);
        citer = (const_iterator)pvVar4->second;
      }
    }
    if (citer == (const_iterator)0x0) {
      __assert_fail("ptNode != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/Trie.hpp"
                    ,0x8d,"void cppjieba::Trie::InsertNode(const Unicode &, const DictUnit *)");
    }
    ((_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> *)(citer + 2))
    ->_M_cur = (__node_type *)
               kmIter.
               super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
               ._M_cur;
  }
  return;
}

Assistant:

void InsertNode(const Unicode& key, const DictUnit* ptValue) {
    if (key.begin() == key.end()) {
      return;
    }

    TrieNode::NextMap::const_iterator kmIter;
    TrieNode *ptNode = root_;
    for (Unicode::const_iterator citer = key.begin(); citer != key.end(); ++citer) {
      if (NULL == ptNode->next) {
        ptNode->next = new TrieNode::NextMap;
      }
      kmIter = ptNode->next->find(*citer);
      if (ptNode->next->end() == kmIter) {
        TrieNode *nextNode = new TrieNode;

        ptNode->next->insert(make_pair(*citer, nextNode));
        ptNode = nextNode;
      } else {
        ptNode = kmIter->second;
      }
    }
    assert(ptNode != NULL);
    ptNode->ptValue = ptValue;
  }